

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

string * google::protobuf::(anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
                   (char *action,MessageLite *message)

{
  long *in_RDX;
  char *in_RSI;
  string *in_RDI;
  string *result;
  string local_70 [32];
  string local_50 [55];
  undefined1 local_19;
  long *local_18;
  char *local_10;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::operator+=((string *)in_RDI,"Can\'t ");
  std::__cxx11::string::operator+=((string *)in_RDI,local_10);
  std::__cxx11::string::operator+=((string *)in_RDI," message of type \"");
  (**(code **)(*local_18 + 0x10))(local_50);
  std::__cxx11::string::operator+=((string *)in_RDI,local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::operator+=((string *)in_RDI,"\" because it is missing required fields: ");
  (**(code **)(*local_18 + 0x48))(local_70);
  std::__cxx11::string::operator+=((string *)in_RDI,local_70);
  std::__cxx11::string::~string(local_70);
  return in_RDI;
}

Assistant:

std::string InitializationErrorMessage(const char* action,
                                       const MessageLite& message) {
  // Note:  We want to avoid depending on strutil in the lite library, otherwise
  //   we'd use:
  //
  // return strings::Substitute(
  //   "Can't $0 message of type \"$1\" because it is missing required "
  //   "fields: $2",
  //   action, message.GetTypeName(),
  //   message.InitializationErrorString());

  std::string result;
  result += "Can't ";
  result += action;
  result += " message of type \"";
  result += message.GetTypeName();
  result += "\" because it is missing required fields: ";
  result += message.InitializationErrorString();
  return result;
}